

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libmeshb7.c
# Opt level: O1

int gmfstatkwdf77_(int64_t *MshIdx,int *KwdIdx,int *NmbTyp,int *SolSiz,int *TypTab,int *deg,
                  int *NmbNod)

{
  char *__s1;
  int iVar1;
  int iVar2;
  int64_t iVar3;
  
  iVar2 = *KwdIdx;
  __s1 = GmfKwdFmt[iVar2][2];
  iVar1 = strcmp(__s1,"hr");
  if (iVar1 == 0) {
    iVar3 = GmfStatKwd(*MshIdx,iVar2,NmbTyp,SolSiz,TypTab,deg,NmbNod);
    iVar2 = (int)iVar3;
  }
  else {
    iVar1 = strcmp(__s1,"sr");
    if (iVar1 == 0) {
      iVar3 = GmfStatKwd(*MshIdx,iVar2,NmbTyp,SolSiz,TypTab);
      iVar2 = (int)iVar3;
    }
    else {
      iVar3 = GmfStatKwd(*MshIdx,iVar2);
      iVar2 = (int)iVar3;
    }
  }
  return iVar2;
}

Assistant:

int APIF77(gmfstatkwdf77)( int64_t *MshIdx, int *KwdIdx, int *NmbTyp,
                           int *SolSiz, int *TypTab, int *deg, int *NmbNod )
{
   if(!strcmp(GmfKwdFmt[ *KwdIdx ][2], "hr"))
      return(GmfStatKwd(*MshIdx, *KwdIdx, NmbTyp, SolSiz, TypTab, deg, NmbNod));
   else if(!strcmp(GmfKwdFmt[ *KwdIdx ][2], "sr"))
      return(GmfStatKwd(*MshIdx, *KwdIdx, NmbTyp, SolSiz, TypTab));
   else
      return(GmfStatKwd(*MshIdx, *KwdIdx));
}